

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::rewriteStructNodeWithSizes
          (Impl *this,Reader node,uint dataWordCount,uint pointerCount)

{
  Reader node_00;
  uint uVar1;
  ArrayPtr<capnp::word> AVar2;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::setRoot<capnp::schema::Node::Reader&>(&builder.super_MessageBuilder,&node);
  MessageBuilder::getRoot<capnp::schema::Node>(&root,&builder.super_MessageBuilder);
  uVar1 = (uint)*(ushort *)((long)root._builder.data + 0xe);
  if (*(ushort *)((long)root._builder.data + 0xe) < dataWordCount) {
    uVar1 = dataWordCount;
  }
  *(short *)((long)root._builder.data + 0xe) = (short)uVar1;
  uVar1 = (uint)*(ushort *)((long)root._builder.data + 0x18);
  if (*(ushort *)((long)root._builder.data + 0x18) < pointerCount) {
    uVar1 = pointerCount;
  }
  *(short *)((long)root._builder.data + 0x18) = (short)uVar1;
  capnp::_::StructBuilder::asReader(&root._builder);
  node_00._reader.capTable = (CapTableReader *)uStack_160;
  node_00._reader.segment = (SegmentReader *)local_168;
  node_00._reader.data = (void *)local_158;
  node_00._reader.pointers = (WirePointer *)uStack_150;
  node_00._reader._32_8_ = local_148;
  node_00._reader._40_8_ = uStack_140;
  AVar2 = makeUncheckedNode(this,node_00);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return AVar2;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::rewriteStructNodeWithSizes(
    schema::Node::Reader node, uint dataWordCount, uint pointerCount) {
  MallocMessageBuilder builder;
  builder.setRoot(node);

  auto root = builder.getRoot<schema::Node>();
  auto newStruct = root.getStruct();
  newStruct.setDataWordCount(kj::max(newStruct.getDataWordCount(), dataWordCount));
  newStruct.setPointerCount(kj::max(newStruct.getPointerCount(), pointerCount));

  return makeUncheckedNode(root);
}